

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

bool __thiscall
cmOutputRequiredFilesCommand::InitialPass
          (cmOutputRequiredFilesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  char *pcVar1;
  cmDependInformation *info;
  FILE *__stream;
  bool bVar2;
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  visited;
  cmLBDepend md;
  allocator local_281;
  undefined1 local_280 [32];
  _Base_ptr local_260;
  size_t local_258;
  cmLBDepend local_250;
  
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x40) {
    std::__cxx11::string::_M_assign((string *)&this->File);
    std::__cxx11::string::_M_assign((string *)&this->OutputFile);
    cmLBDepend::cmLBDepend(&local_250);
    cmLBDepend::SetMakefile(&local_250,(this->super_cmCommand).Makefile);
    pcVar1 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)local_280,pcVar1,&local_281);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_250.IncludeDirectories,(value_type *)local_280);
    std::__cxx11::string::~string((string *)local_280);
    info = cmLBDepend::FindDependencies(&local_250,(this->File)._M_dataplus._M_p);
    bVar2 = true;
    if (info != (cmDependInformation *)0x0) {
      __stream = (FILE *)cmsys::SystemTools::Fopen(&this->OutputFile,"w");
      if (__stream == (FILE *)0x0) {
        std::__cxx11::string::string((string *)local_280,"Can not open output file: ",&local_281);
        std::__cxx11::string::append((string *)local_280);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_280);
        std::__cxx11::string::~string((string *)local_280);
        bVar2 = false;
      }
      else {
        local_280._24_8_ = local_280 + 8;
        local_280._8_4_ = _S_red;
        local_280._16_8_ = 0;
        local_258 = 0;
        local_260 = (_Base_ptr)local_280._24_8_;
        ListDependencies(this,info,(FILE *)__stream,
                         (set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
                          *)local_280);
        fclose(__stream);
        std::
        _Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
        ::~_Rb_tree((_Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
                     *)local_280);
      }
    }
    cmLBDepend::~cmLBDepend(&local_250);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_250,"called with incorrect number of arguments",
               (allocator *)local_280);
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmOutputRequiredFilesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the arg for final pass
  this->File = args[0];
  this->OutputFile = args[1];

  // compute the list of files
  cmLBDepend md;
  md.SetMakefile(this->Makefile);
  md.AddSearchPath(this->Makefile->GetCurrentSourceDirectory());
  // find the depends for a file
  const cmDependInformation* info = md.FindDependencies(this->File.c_str());
  if (info) {
    // write them out
    FILE* fout = cmsys::SystemTools::Fopen(this->OutputFile, "w");
    if (!fout) {
      std::string err = "Can not open output file: ";
      err += this->OutputFile;
      this->SetError(err);
      return false;
    }
    std::set<cmDependInformation const*> visited;
    this->ListDependencies(info, fout, &visited);
    fclose(fout);
  }

  return true;
}